

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void writeLZ77data(LodePNGBitWriter *writer,uivector *lz77_encoded,HuffmanTree *tree_ll,
                  HuffmanTree *tree_d)

{
  long *in_RSI;
  uint distance_extra_bits;
  uint n_distance_extra_bits;
  uint distance_index;
  uint distance_code;
  uint length_extra_bits;
  uint n_length_extra_bits;
  uint length_index;
  uint val;
  size_t i;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint uVar1;
  long local_28;
  
  for (local_28 = 0; local_28 != in_RSI[1]; local_28 = local_28 + 1) {
    uVar1 = *(uint *)(*in_RSI + local_28 * 4);
    writeBitsReversed((LodePNGBitWriter *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc,
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (0x100 < uVar1) {
      in_stack_ffffffffffffffd0 = uVar1 - 0x101;
      in_stack_ffffffffffffffcc = LENGTHEXTRA[in_stack_ffffffffffffffd0];
      in_stack_ffffffffffffffc0 = *(undefined4 *)(*in_RSI + 4 + (local_28 + 1) * 4);
      local_28 = local_28 + 3;
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc0;
      writeBits((LodePNGBitWriter *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffcc,
                CONCAT44(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc0));
      writeBitsReversed((LodePNGBitWriter *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcc,
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      writeBits((LodePNGBitWriter *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                in_stack_ffffffffffffffcc,
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
  }
  return;
}

Assistant:

static void writeLZ77data(LodePNGBitWriter* writer, const uivector* lz77_encoded,
  const HuffmanTree* tree_ll, const HuffmanTree* tree_d) {
  size_t i = 0;
  for (i = 0; i != lz77_encoded->size; ++i) {
    unsigned val = lz77_encoded->data[i];
    writeBitsReversed(writer, tree_ll->codes[val], tree_ll->lengths[val]);
    if (val > 256) /*for a length code, 3 more things have to be added*/ {
      unsigned length_index = val - FIRST_LENGTH_CODE_INDEX;
      unsigned n_length_extra_bits = LENGTHEXTRA[length_index];
      unsigned length_extra_bits = lz77_encoded->data[++i];

      unsigned distance_code = lz77_encoded->data[++i];

      unsigned distance_index = distance_code;
      unsigned n_distance_extra_bits = DISTANCEEXTRA[distance_index];
      unsigned distance_extra_bits = lz77_encoded->data[++i];

      writeBits(writer, length_extra_bits, n_length_extra_bits);
      writeBitsReversed(writer, tree_d->codes[distance_code], tree_d->lengths[distance_code]);
      writeBits(writer, distance_extra_bits, n_distance_extra_bits);
    }
  }
}